

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

int ly_path_data2schema_subexp
              (ly_ctx *ctx,lys_node *orig_parent,lys_module *cur_mod,lyxp_expr *exp,
              uint16_t *cur_exp,char **out,uint16_t *out_used)

{
  lyxp_token lVar1;
  bool bVar2;
  bool bVar3;
  ushort uVar4;
  int iVar5;
  uint uVar6;
  byte *__s;
  char *pcVar7;
  lys_node *last;
  lys_module *plVar8;
  lys_module *plVar9;
  lys_node *plVar10;
  size_t sVar11;
  char *pcVar12;
  size_t sVar13;
  ushort **ppuVar14;
  byte *__s2;
  uint16_t cur_exp_00;
  LY_VLOG_ELEM elem_type;
  LY_ERR no;
  ulong uVar15;
  LY_ECODE ecode;
  ushort uVar16;
  short sVar17;
  short sVar18;
  byte *pbVar19;
  ulong uVar20;
  long lVar21;
  bool bVar22;
  lys_module *local_78;
  char *local_70;
  lyxp_token local_54;
  lys_node *local_50;
  
  uVar4 = *cur_exp;
  uVar20 = (ulong)uVar4;
  lVar1 = exp->tokens[uVar20];
  if (lVar1 == LYXP_TOKEN_PAR1) {
    iVar5 = ly_path_data2schema_copy_token(ctx,exp,uVar4,out,out_used);
    if (iVar5 != 0) {
LAB_0010aac8:
      __s = (byte *)0x0;
LAB_0010aaca:
      free(__s);
      return -1;
    }
    uVar6 = *cur_exp + 1;
    *cur_exp = (uint16_t)uVar6;
    local_54 = LYXP_TOKEN_PAR2;
  }
  else {
    if (lVar1 == LYXP_TOKEN_OPERATOR_PATH) {
      bVar3 = true;
      local_54 = LYXP_TOKEN_NONE;
      bVar22 = orig_parent == (lys_node *)0x0;
      goto LAB_0010ab01;
    }
    bVar22 = true;
    if (lVar1 != LYXP_TOKEN_BRACK1) {
      bVar3 = true;
      local_54 = LYXP_TOKEN_NONE;
      goto LAB_0010ab01;
    }
    iVar5 = ly_path_data2schema_copy_token(ctx,exp,uVar4,out,out_used);
    if (iVar5 != 0) goto LAB_0010aac8;
    uVar6 = *cur_exp + 1;
    *cur_exp = (uint16_t)uVar6;
    local_54 = LYXP_TOKEN_BRACK2;
  }
  bVar22 = false;
  uVar20 = (ulong)uVar6;
  bVar3 = false;
LAB_0010ab01:
  if ((ushort)uVar20 < exp->used) {
    bVar2 = false;
    local_78 = cur_mod;
    local_50 = orig_parent;
    do {
      uVar15 = uVar20 & 0xffff;
      cur_exp_00 = (uint16_t)uVar20;
      switch(exp->tokens[uVar15]) {
      case LYXP_TOKEN_PAR1:
      case LYXP_TOKEN_BRACK1:
        iVar5 = ly_path_data2schema_subexp(ctx,local_50,local_78,exp,cur_exp,out,out_used);
        goto LAB_0010ab5d;
      default:
        if (bVar3 || exp->tokens[uVar15] != local_54) {
          uVar20 = (ulong)(uint)((int)uVar15 * 2);
          __s = (byte *)0x0;
          ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid token used (%.*s).",
                 (ulong)*(ushort *)((long)exp->tok_len + uVar20),
                 exp->expr + *(ushort *)((long)exp->expr_pos + uVar20));
        }
        else {
          iVar5 = ly_path_data2schema_copy_token(ctx,exp,cur_exp_00,out,out_used);
          __s = (byte *)0x0;
          if (iVar5 == 0) {
            return 0;
          }
        }
        goto LAB_0010aaca;
      case LYXP_TOKEN_DOT:
      case LYXP_TOKEN_DDOT:
      case LYXP_TOKEN_NAMETEST:
        if (bVar2) {
          iVar5 = ly_path_data2schema_copy_token(ctx,exp,cur_exp_00,out,out_used);
          bVar2 = true;
          goto LAB_0010ab5d;
        }
        uVar20 = (ulong)(uint)((int)uVar15 * 2);
        __s = (byte *)strndup(exp->expr + *(ushort *)((long)exp->expr_pos + uVar20),
                              (ulong)*(ushort *)((long)exp->tok_len + uVar20));
        if (__s == (byte *)0x0) {
          pcVar7 = "Memory allocation failed (%s()).";
          pcVar12 = "ly_path_data2schema_subexp";
          no = LY_EMEM;
LAB_0010b058:
          __s = (byte *)0x0;
          ly_log(ctx,LY_LLERR,no,pcVar7,pcVar12);
          goto LAB_0010aaca;
        }
        pcVar7 = strchr((char *)__s,0x3a);
        if (pcVar7 == (char *)0x0) {
          if (bVar22) {
            ecode = LYE_PATH_MISSMOD;
            elem_type = LY_VLOG_NONE;
            __s2 = (byte *)0x0;
LAB_0010afcc:
            ly_vlog(ctx,ecode,elem_type,__s2);
            goto LAB_0010aaca;
          }
          pbVar19 = (byte *)0x0;
        }
        else {
          *pcVar7 = '\0';
          pbVar19 = (byte *)(pcVar7 + 1);
          if ((bVar22) &&
             (local_78 = ly_ctx_get_module(ctx,(char *)__s,(char *)0x0,0),
             local_78 == (lys_module *)0x0)) {
            ly_vlog(ctx,LYE_PATH_INMOD,LY_VLOG_STR,__s);
            goto LAB_0010aaca;
          }
        }
        __s2 = __s;
        if (pbVar19 != (byte *)0x0) {
          __s2 = pbVar19;
        }
        if ((*__s2 | 4) == 0x2e) {
          free(__s);
          if (bVar3) {
            iVar5 = ly_path_data2schema_copy_token(ctx,exp,*cur_exp,out,out_used);
            bVar2 = true;
            bVar22 = false;
            goto LAB_0010ab5d;
          }
          pcVar7 = "Invalid path used (%s in a subexpression).";
          no = LY_EINVAL;
          pcVar12 = (char *)0x0;
          goto LAB_0010b058;
        }
        last = (lys_node *)0x0;
        do {
          while( true ) {
            do {
              last = lys_getnext(last,local_50,local_78,0x100);
              if (last == (lys_node *)0x0) {
                ecode = LYE_PATH_INNODE;
                elem_type = LY_VLOG_STR;
                goto LAB_0010afcc;
              }
              iVar5 = strcmp(last->name,(char *)__s2);
            } while (iVar5 != 0);
            plVar8 = lys_node_module(last);
            if (pbVar19 == (byte *)0x0) break;
            iVar5 = strcmp(plVar8->name,(char *)__s);
            if (iVar5 == 0) goto LAB_0010ad0e;
          }
          plVar9 = lys_node_module(local_50);
        } while (plVar8 != plVar9);
LAB_0010ad0e:
        if (last != local_50) {
          sVar17 = 0;
          plVar10 = last;
          do {
            plVar10 = lys_parent(plVar10);
            if ((plVar10 == (lys_node *)0x0) || (plVar10->nodetype != LYS_USES)) {
              sVar17 = sVar17 + 1;
            }
          } while (plVar10 != local_50);
          if (sVar17 != 0) {
            lVar21 = 0;
            pcVar7 = "";
            do {
              sVar17 = sVar17 + -1;
              plVar10 = last;
              for (sVar18 = sVar17; sVar18 != 0;
                  sVar18 = sVar18 - (ushort)(plVar10->nodetype != LYS_USES)) {
                plVar10 = lys_parent(plVar10);
                if (plVar10 == (lys_node *)0x0) {
                  __assert_fail("node2",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/common.c"
                                ,0x43b,
                                "int ly_path_data2schema_subexp(const struct ly_ctx *, const struct lys_node *, const struct lys_module *, struct lyxp_expr *, uint16_t *, char **, uint16_t *)"
                               );
                }
              }
              plVar8 = lys_node_module(plVar10);
              if (plVar8 == local_78 && local_50 != (lys_node *)0x0) {
                sVar11 = strlen(plVar10->name);
                uVar6 = (int)lVar21 + (int)sVar11;
                sVar18 = (short)uVar6;
                local_70 = *out;
                pcVar12 = (char *)realloc(local_70,((ulong)uVar6 & 0xffff) + (ulong)*out_used);
                if (pcVar12 == (char *)0x0) {
LAB_0010b064:
                  free(local_70);
                  *out = (char *)0x0;
                  goto LAB_0010b078;
                }
                *out = pcVar12;
                sprintf(pcVar12 + ((ulong)*out_used - 1),"%s%s",pcVar7,plVar10->name);
              }
              else {
                plVar8 = lys_node_module(plVar10);
                sVar11 = strlen(plVar8->name);
                sVar13 = strlen(plVar10->name);
                uVar20 = sVar13 + lVar21 + sVar11 + 1;
                sVar18 = (short)uVar20;
                local_70 = *out;
                pcVar12 = (char *)realloc(local_70,(uVar20 & 0xffff) + (ulong)*out_used);
                if (pcVar12 == (char *)0x0) goto LAB_0010b064;
                *out = pcVar12;
                uVar4 = *out_used;
                plVar8 = lys_node_module(plVar10);
                sprintf(pcVar12 + ((ulong)uVar4 - 1),"%s%s:%s",pcVar7,plVar8->name,plVar10->name);
              }
              *out_used = sVar18 + *out_used;
              lVar21 = 1;
              pcVar7 = "/";
            } while (sVar17 != 0);
          }
        }
        ppuVar14 = __ctype_b_loc();
        sVar17 = 1;
        uVar4 = 0;
        do {
          uVar16 = uVar4;
          sVar17 = sVar17 + -1;
          uVar4 = uVar16 + 1;
        } while ((*(byte *)((long)*ppuVar14 +
                           (long)exp->expr[(ulong)((uint)*(ushort *)
                                                          ((long)exp->expr_pos +
                                                          (ulong)((uint)*cur_exp * 2)) +
                                                  (uint)uVar16) +
                                           (ulong)*(ushort *)
                                                   ((long)exp->tok_len + (ulong)((uint)*cur_exp * 2)
                                                   )] * 2 + 1) & 0x20) != 0);
        if (sVar17 != 0) {
          pcVar7 = (char *)ly_realloc(*out,(ulong)((uint)*out_used + (uint)uVar16));
          *out = pcVar7;
          if (pcVar7 == (char *)0x0) {
LAB_0010b078:
            ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                   "ly_path_data2schema_subexp");
            goto LAB_0010aaca;
          }
          sprintf(pcVar7 + ((ulong)*out_used - 1),"%*s",(ulong)(uint)uVar16," ");
          *out_used = *out_used - sVar17;
        }
        free(__s);
        bVar22 = false;
        bVar2 = false;
        local_50 = last;
        goto LAB_0010ab65;
      case LYXP_TOKEN_COMMA:
      case LYXP_TOKEN_OPERATOR_LOG:
      case LYXP_TOKEN_OPERATOR_COMP:
      case LYXP_TOKEN_OPERATOR_MATH:
      case LYXP_TOKEN_OPERATOR_UNI:
        bVar2 = false;
        bVar22 = true;
        local_50 = orig_parent;
        break;
      case LYXP_TOKEN_NODETYPE:
      case LYXP_TOKEN_FUNCNAME:
      case LYXP_TOKEN_LITERAL:
      case LYXP_TOKEN_NUMBER:
        break;
      case LYXP_TOKEN_OPERATOR_PATH:
        if (exp->tok_len[uVar15] == 2) {
          bVar2 = true;
        }
      }
      iVar5 = ly_path_data2schema_copy_token(ctx,exp,cur_exp_00,out,out_used);
LAB_0010ab5d:
      if (iVar5 != 0) goto LAB_0010aac8;
LAB_0010ab65:
      uVar20 = (ulong)(*cur_exp + 1);
      uVar4 = (ushort)(*cur_exp + 1);
      *cur_exp = uVar4;
    } while (uVar4 < exp->used);
  }
  if (!bVar3) {
    ly_vlog(ctx,LYE_XPATH_EOF,LY_VLOG_NONE,(void *)0x0);
    return -1;
  }
  return 0;
}

Assistant:

static int
ly_path_data2schema_subexp(const struct ly_ctx *ctx, const struct lys_node *orig_parent, const struct lys_module *cur_mod,
                           struct lyxp_expr *exp, uint16_t *cur_exp, char **out, uint16_t *out_used)
{
    uint16_t j, k, len, slash;
    char *str = NULL, *col;
    const struct lys_node *node, *node2, *parent;
    enum lyxp_token end_token = 0;
    int first, path_lost;

    switch (exp->tokens[*cur_exp]) {
    case LYXP_TOKEN_BRACK1:
        end_token = LYXP_TOKEN_BRACK2;

        if (ly_path_data2schema_copy_token(ctx, exp, *cur_exp, out, out_used)) {
            goto error;
        }
        ++(*cur_exp);
        first = 0;
        break;
    case LYXP_TOKEN_PAR1:
        end_token = LYXP_TOKEN_PAR2;

        if (ly_path_data2schema_copy_token(ctx, exp, *cur_exp, out, out_used)) {
            goto error;
        }
        ++(*cur_exp);
        first = 0;
        break;
    case LYXP_TOKEN_OPERATOR_PATH:
        first = (orig_parent) ? 0 : 1;
        break;
    default:
        first = 1;
        break;
    }

    path_lost = 0;
    parent = orig_parent;
    while (*cur_exp < exp->used) {
        switch (exp->tokens[*cur_exp]) {
        case LYXP_TOKEN_DOT:
        case LYXP_TOKEN_DDOT:
        case LYXP_TOKEN_NAMETEST:
            if (path_lost) {
                /* we do not know anything anymore, just copy it */
                if (ly_path_data2schema_copy_token(ctx, exp, *cur_exp, out, out_used)) {
                    goto error;
                }
                break;
            }

            str = strndup(exp->expr + exp->expr_pos[*cur_exp], exp->tok_len[*cur_exp]);
            LY_CHECK_ERR_GOTO(!str, LOGMEM(ctx), error);

            col = strchr(str, ':');
            if (col) {
                *col = '\0';
                ++col;
            }

            /* first node */
            if (first) {
                if (!col) {
                    LOGVAL(ctx, LYE_PATH_MISSMOD, LY_VLOG_NONE, NULL);
                    goto error;
                }

                cur_mod = ly_ctx_get_module(ctx, str, NULL, 0);
                if (!cur_mod) {
                    LOGVAL(ctx, LYE_PATH_INMOD, LY_VLOG_STR, str);
                    goto error;
                }

                first = 0;
            }

            if (((col ? col[0] : str[0]) == '.') || ((col ? col[0] : str[0]) == '*')) {
                free(str);
                str = NULL;

                if (end_token) {
                    LOGERR(ctx, LY_EINVAL, "Invalid path used (%s in a subexpression).", str);
                    goto error;
                }

                /* we can no longer evaluate the path, so just copy the rest */
                path_lost = 1;
                if (ly_path_data2schema_copy_token(ctx, exp, *cur_exp, out, out_used)) {
                    goto error;
                }
                break;
            }

            /* create schema path for this data node */
            node = NULL;
            while ((node = lys_getnext(node, parent, cur_mod, LYS_GETNEXT_NOSTATECHECK))) {
                if (strcmp(node->name, col ? col : str)) {
                    continue;
                }

                if (col && strcmp(lys_node_module(node)->name, str)) {
                    continue;
                }
                if (!col && (lys_node_module(node) != lys_node_module(parent))) {
                    continue;
                }

                /* determine how deep the node actually is, we must generate the path from the highest parent */
                j = 0;
                node2 = node;
                while (node2 != parent) {
                    node2 = lys_parent(node2);
                    if (!node2 || (node2->nodetype != LYS_USES)) {
                        ++j;
                    }
                }

                /* first node, do not print '/' */
                slash = 0;
                while (j) {
                    k = j - 1;
                    node2 = node;
                    while (k) {
                        node2 = lys_parent(node2);
                        assert(node2);
                        if (node2->nodetype != LYS_USES) {
                            --k;
                        }
                    }

                    if ((lys_node_module(node2) != cur_mod) || !parent) {
                        /* module name and node name */
                        len = slash + strlen(lys_node_module(node2)->name) + 1 + strlen(node2->name);
                        *out = ly_realloc(*out, *out_used + len);
                        LY_CHECK_ERR_GOTO(!(*out), LOGMEM(ctx), error);
                        sprintf(*out + *out_used - 1, "%s%s:%s", slash ? "/" : "", lys_node_module(node2)->name, node2->name);
                        *out_used += len;
                    } else {
                        /* only node name */
                        len = slash + strlen(node2->name);
                        *out = ly_realloc(*out, *out_used + len);
                        LY_CHECK_ERR_GOTO(!(*out), LOGMEM(ctx), error);
                        sprintf(*out + *out_used - 1, "%s%s", slash ? "/" : "", node2->name);
                        *out_used += len;
                    }

                    slash = 1;
                    --j;
                }

                break;
            }
            if (!node) {
                LOGVAL(ctx, LYE_PATH_INNODE, LY_VLOG_STR, col ? col : str);
                goto error;
            }

            /* copy any whitespaces */
            for (len = 0; isspace(exp->expr[exp->expr_pos[*cur_exp] + exp->tok_len[*cur_exp] + len]); ++len);
            if (len) {
                *out = ly_realloc(*out, *out_used + len);
                LY_CHECK_ERR_GOTO(!(*out), LOGMEM(ctx), error);
                sprintf(*out + *out_used - 1, "%*s", len, " ");
                *out_used += len;
            }

            /* next iteration */
            free(str);
            str = NULL;
            parent = node;
            break;
        case LYXP_TOKEN_COMMA:
        case LYXP_TOKEN_OPERATOR_LOG:
        case LYXP_TOKEN_OPERATOR_COMP:
        case LYXP_TOKEN_OPERATOR_MATH:
        case LYXP_TOKEN_OPERATOR_UNI:
            /* reset the processing */
            first = 1;
            path_lost = 0;
            parent = orig_parent;

            /* fallthrough */
        case LYXP_TOKEN_OPERATOR_PATH:
            if ((exp->tokens[*cur_exp] == LYXP_TOKEN_OPERATOR_PATH) && (exp->tok_len[*cur_exp] == 2)) {
                /* we can no longer evaluate the path further */
                path_lost = 1;
            }
            /* fallthrough */
        case LYXP_TOKEN_NODETYPE:
        case LYXP_TOKEN_FUNCNAME:
        case LYXP_TOKEN_LITERAL:
        case LYXP_TOKEN_NUMBER:
            /* just copy it */
            if (ly_path_data2schema_copy_token(ctx, exp, *cur_exp, out, out_used)) {
                goto error;
            }
            break;
        case LYXP_TOKEN_BRACK1:
        case LYXP_TOKEN_PAR1:
            if (ly_path_data2schema_subexp(ctx, parent, cur_mod, exp, cur_exp, out, out_used)) {
                goto error;
            }
            break;
        default:
            if (end_token && (exp->tokens[*cur_exp] == end_token)) {
                /* we are done (with this subexpression) */
                if (ly_path_data2schema_copy_token(ctx, exp, *cur_exp, out, out_used)) {
                    goto error;
                }

                return 0;
            }
            LOGERR(ctx, LY_EINVAL, "Invalid token used (%.*s).", exp->tok_len[*cur_exp], exp->expr + exp->expr_pos[*cur_exp]);
            goto error;
        }

        ++(*cur_exp);
    }

    if (end_token) {
        LOGVAL(ctx, LYE_XPATH_EOF, LY_VLOG_NONE, NULL);
        return -1;
    }

    return 0;

error:
    free(str);
    return -1;
}